

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Server_browseNext_single
               (UA_Server *server,UA_Session *session,UA_Boolean releaseContinuationPoint,
               UA_ByteString *continuationPoint,UA_BrowseResult *result)

{
  UA_Boolean UVar1;
  ContinuationPointEntry *cp;
  
  result->statusCode = 0x804a0000;
  cp = (ContinuationPointEntry *)&session->continuationPoints;
  do {
    cp = (cp->pointers).le_next;
    if (cp == (ContinuationPointEntry *)0x0) {
      return;
    }
    UVar1 = UA_String_equal(&cp->identifier,continuationPoint);
  } while (!UVar1);
  result->statusCode = 0;
  if (releaseContinuationPoint) {
    removeCp(cp,session);
    return;
  }
  Service_Browse_single(server,session,cp,(UA_BrowseDescription *)0x0,0,result);
  return;
}

Assistant:

static void
UA_Server_browseNext_single(UA_Server *server, UA_Session *session, UA_Boolean releaseContinuationPoint,
                            const UA_ByteString *continuationPoint, UA_BrowseResult *result) {
    result->statusCode = UA_STATUSCODE_BADCONTINUATIONPOINTINVALID;
    struct ContinuationPointEntry *cp, *temp;
    LIST_FOREACH_SAFE(cp, &session->continuationPoints, pointers, temp) {
        if(UA_ByteString_equal(&cp->identifier, continuationPoint)) {
            result->statusCode = UA_STATUSCODE_GOOD;
            if(!releaseContinuationPoint)
                Service_Browse_single(server, session, cp, NULL, 0, result);
            else
                removeCp(cp, session);
            break;
        }
    }
}